

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O3

int coda_expression_eval_integer(coda_expression *expr,coda_cursor *cursor,int64_t *value)

{
  coda_cursor *cursor2;
  int iVar1;
  char *message;
  eval_info info;
  eval_info local_360;
  
  if (expr->result_type == coda_expression_integer) {
    if (cursor != (coda_cursor *)0x0) {
      cursor2 = &local_360.cursor;
      local_360.orig_cursor = cursor;
      memcpy(cursor2,cursor,0x310);
      local_360.index[0] = 0;
      local_360.index[1] = 0;
      local_360.index[2] = 0;
      local_360.variable_index = 0;
      local_360.variable_name = (char *)0x0;
      iVar1 = eval_integer(&local_360,expr,value);
      if (iVar1 == 0) {
        return 0;
      }
      iVar1 = coda_cursor_compare(cursor,cursor2);
      if (iVar1 == 0) {
        return -1;
      }
      coda_cursor_add_to_error_message(cursor2);
      return -1;
    }
    if (expr->is_constant != 0) {
      local_360.orig_cursor = (coda_cursor *)0x0;
      local_360.index[0] = 0;
      local_360.index[1] = 0;
      local_360.index[2] = 0;
      local_360.variable_index = 0;
      local_360.variable_name = (char *)0x0;
      iVar1 = eval_integer(&local_360,expr,value);
      return -(uint)(iVar1 != 0);
    }
    message = "cursor argument may not be NULL if expression is not constant";
  }
  else {
    message = "expression is not an \'integer\' expression";
  }
  coda_set_error(-100,message);
  return -1;
}

Assistant:

LIBCODA_API int coda_expression_eval_integer(const coda_expression *expr, const coda_cursor *cursor, int64_t *value)
{
    eval_info info;

    if (expr->result_type != coda_expression_integer)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "expression is not an 'integer' expression");
        return -1;
    }
    if (cursor == NULL && !expr->is_constant)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cursor argument may not be NULL if expression is not constant");
        return -1;
    }

    init_eval_info(&info, cursor);
    if (eval_integer(&info, expr, value) != 0)
    {
        if (cursor != NULL && coda_cursor_compare(cursor, &info.cursor) != 0)
        {
            coda_cursor_add_to_error_message(&info.cursor);
        }
        return -1;
    }

    return 0;
}